

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_311ffb::Handlers::endCopyAttachmentsFrom(Handlers *this)

{
  element_type *this_00;
  shared_ptr<QPDFJob::CopyAttConfig> local_20;
  Handlers *local_10;
  Handlers *this_local;
  
  local_10 = this;
  this_00 = std::
            __shared_ptr_access<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->c_copy_att);
  QPDFJob::CopyAttConfig::endCopyAttachmentsFrom(this_00);
  std::shared_ptr<QPDFJob::CopyAttConfig>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<QPDFJob::CopyAttConfig>::operator=(&this->c_copy_att,&local_20);
  std::shared_ptr<QPDFJob::CopyAttConfig>::~shared_ptr(&local_20);
  return;
}

Assistant:

void
Handlers::endCopyAttachmentsFrom()
{
    this->c_copy_att->endCopyAttachmentsFrom();
    this->c_copy_att = nullptr;
}